

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::
strTree<char_const(&)[7],kj::String&,char,kj::StringPtr&,kj::String&,char_const(&)[22],kj::CappedArray<char,17ul>,char_const(&)[10],unsigned_int,char_const(&)[4]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [7],String *params_1,
          char *params_2,StringPtr *params_3,String *params_4,char (*params_5) [22],
          CappedArray<char,_17UL> *params_6,char (*params_7) [10],uint *params_8,
          char (*params_9) [4])

{
  char *pcVar1;
  ArrayPtr<const_char> *params_9_00;
  undefined1 local_c9 [9];
  long local_c0;
  ArrayPtr<const_char> local_b8;
  ArrayPtr<const_char> local_a8;
  ArrayPtr<const_char> local_98;
  ArrayPtr<const_char> local_88;
  ArrayPtr<const_char> local_78;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  CappedArray<char,_14UL> local_48;
  
  local_a8 = toCharSequence<char_const(&)[7]>((char (*) [7])this);
  pcVar1 = *(char **)(params[1] + 1);
  local_b8.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_b8.ptr = *(char **)params;
  }
  local_b8.size_ = (size_t)(pcVar1 + -1);
  if (pcVar1 == (char *)0x0) {
    local_b8.size_ = (size_t)(char *)0x0;
  }
  local_c9[0] = *(undefined1 *)&(params_1->content).ptr;
  local_c9._1_8_ = *(undefined8 *)params_2;
  local_c0 = *(long *)(params_2 + 8) + -1;
  pcVar1 = (char *)(params_3->content).size_;
  local_58.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_58.ptr = (params_3->content).ptr;
  }
  local_58.size_ = (size_t)(pcVar1 + -1);
  if (pcVar1 == (char *)0x0) {
    local_58.size_ = (size_t)(char *)0x0;
  }
  local_68 = toCharSequence<char_const(&)[22]>((char (*) [22])params_4);
  local_78.size_ = *(size_t *)*params_5;
  local_78.ptr = *params_5 + 8;
  local_88 = toCharSequence<char_const(&)[10]>((char (*) [10])params_6);
  toCharSequence<unsigned_int>(&local_48,(uint *)params_7);
  params_9_00 = (ArrayPtr<const_char> *)0x174495;
  local_98 = toCharSequence<char_const(&)[4]>((char (*) [4])params_8);
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_a8,&local_b8,
             (ArrayPtr<const_char> *)local_c9,(FixedArray<char,_1UL> *)(local_c9 + 1),&local_58,
             &local_68,&local_78,&local_88,(ArrayPtr<const_char> *)&local_48,
             (CappedArray<char,_14UL> *)&local_98,params_9_00);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}